

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cc
# Opt level: O2

metasize_t btree_read_meta(btree *btree,void *buf)

{
  voidref addr;
  bnode *pbVar1;
  metasize_t mVar2;
  
  addr = (*btree->blk_ops->blk_read)(btree->blk_handle,btree->root_bid);
  pbVar1 = _fetch_bnode(btree,addr,btree->height);
  if ((pbVar1->flag & 2) == 0) {
    mVar2 = 0;
  }
  else {
    mVar2 = pbVar1[1].kvsize << 8 | pbVar1[1].kvsize >> 8;
    memcpy(buf,&pbVar1[1].flag,(ulong)mVar2);
  }
  return mVar2;
}

Assistant:

metasize_t btree_read_meta(struct btree *btree, void *buf)
{
    void *addr;
    void *ptr;
    metasize_t size;
    struct bnode *node;

    addr = btree->blk_ops->blk_read(btree->blk_handle, btree->root_bid);
    node = _fetch_bnode(btree, addr, btree->height);
    if (node->flag & BNODE_MASK_METADATA) {
        ptr = ((uint8_t *)node) + sizeof(struct bnode);
        memcpy(&size, (uint8_t *)ptr, sizeof(metasize_t));
        size = _endian_decode(size);
        memcpy(buf, (uint8_t *)ptr + sizeof(metasize_t), size);
    } else {
        size = 0;
    }

    return size;
}